

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wm_abstract.h
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
rw::operator<<(basic_ostream<char,_std::char_traits<char>_> *stream,
              vector<rw::Window_*,_std::allocator<rw::Window_*>_> *v)

{
  bool bVar1;
  ostream *stream_00;
  reference ppWVar2;
  __normal_iterator<rw::Window_*const_*,_std::vector<rw::Window_*,_std::allocator<rw::Window_*>_>_>
  local_38;
  Window **local_30;
  __normal_iterator<rw::Window_*const_*,_std::vector<rw::Window_*,_std::allocator<rw::Window_*>_>_>
  local_28;
  __normal_iterator<rw::Window_*const_*,_std::vector<rw::Window_*,_std::allocator<rw::Window_*>_>_>
  local_20;
  const_iterator i;
  vector<rw::Window_*,_std::allocator<rw::Window_*>_> *v_local;
  basic_ostream<char,_std::char_traits<char>_> *stream_local;
  
  i._M_current = (Window **)v;
  std::operator<<(stream,"[");
  local_20._M_current =
       (Window **)std::vector<rw::Window_*,_std::allocator<rw::Window_*>_>::begin(v);
  local_28._M_current = (Window **)std::vector<rw::Window_*,_std::allocator<rw::Window_*>_>::end(v);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
  if (bVar1) {
    ppWVar2 = __gnu_cxx::
              __normal_iterator<rw::Window_*const_*,_std::vector<rw::Window_*,_std::allocator<rw::Window_*>_>_>
              ::operator*(&local_20);
    operator<<(stream,*ppWVar2);
    local_30 = (Window **)
               __gnu_cxx::
               __normal_iterator<rw::Window_*const_*,_std::vector<rw::Window_*,_std::allocator<rw::Window_*>_>_>
               ::operator++(&local_20,0);
  }
  while( true ) {
    local_38._M_current =
         (Window **)std::vector<rw::Window_*,_std::allocator<rw::Window_*>_>::end(v);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_38);
    if (!bVar1) break;
    stream_00 = std::operator<<(stream,",\n ");
    ppWVar2 = __gnu_cxx::
              __normal_iterator<rw::Window_*const_*,_std::vector<rw::Window_*,_std::allocator<rw::Window_*>_>_>
              ::operator*(&local_20);
    operator<<(stream_00,*ppWVar2);
    __gnu_cxx::
    __normal_iterator<rw::Window_*const_*,_std::vector<rw::Window_*,_std::allocator<rw::Window_*>_>_>
    ::operator++(&local_20,0);
  }
  std::operator<<(stream,"]");
  return stream;
}

Assistant:

T &operator<<(T &stream, const vector<Window *> v) {
        stream << "[";
        auto i = v.begin();
        if (i != v.end()) {
            stream << *i;
            i++;
        }
        while (i != v.end()) {
            stream << ",\n " << *i;
            i++;
        }
        stream << "]";
        return stream;
    }